

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleAttributeTranslation.cpp
# Opt level: O1

void printObject(Builder *b)

{
  ostream *poVar1;
  string_view sVar2;
  Slice s;
  ObjectIterator __begin1;
  Slice local_b0;
  string local_a8;
  undefined1 local_88 [16];
  ObjectIterator local_78;
  ObjectIterator local_50;
  
  local_b0._start = arangodb::velocypack::Builder::start(b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Slice: ",7);
  poVar1 = arangodb::velocypack::operator<<((ostream *)&std::cout,&local_b0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Type: ",6);
  poVar1 = operator<<((ostream *)&std::cout,
                      arangodb::velocypack::SliceStaticData::TypeMap[*local_b0._start]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bytesize: ",10);
  if ("\x01\x01"[*local_b0._start] == '\0') {
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
    byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&local_b0
                    ,local_b0._start);
  }
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Members: ",9);
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::length
            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&local_b0);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Iterating Object members:",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  arangodb::velocypack::ObjectIterator::ObjectIterator(&local_50,local_b0,true);
  local_78._size = local_50._size;
  local_78._position = local_50._position;
  local_78._slice._start = local_50._slice._start;
  local_78._current = local_50._current;
  if (local_50._position != local_50._size) {
    do {
      local_88 = (undefined1  [16])arangodb::velocypack::ObjectIterator::operator*(&local_78);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"key: ",5);
      sVar2 = arangodb::velocypack::
              SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::stringView
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                         local_88);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,sVar2._M_str,sVar2._M_len);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", value: ",9);
      arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
      toJson_abi_cxx11_(&local_a8,
                        (SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)
                        (local_88 + 8),&arangodb::velocypack::Options::Defaults);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,local_a8._M_dataplus._M_p,local_a8._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      arangodb::velocypack::ObjectIterator::next(&local_78);
    } while (local_78._position != local_78._size);
  }
  return;
}

Assistant:

static void printObject(Builder const& b) {
  // a Slice is a lightweight accessor for a VPack value
  Slice s(b.start());

  // inspect the outermost value (should be an Object...)
  std::cout << "Slice: " << s << std::endl;
  std::cout << "Type: " << s.type() << std::endl;
  std::cout << "Bytesize: " << s.byteSize() << std::endl;
  std::cout << "Members: " << s.length() << std::endl;

  // now iterate over the object members
  // the attribute name translator works transparently
  std::cout << "Iterating Object members:" << std::endl;
  for (auto const& it : ObjectIterator(s, /*useSequentialIteration*/ true)) {
    std::cout << "key: " << it.key.stringView()
              << ", value: " << it.value.toJson() << std::endl;
  }
}